

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O3

optional<unsigned_long> __thiscall graph_utils::Dsu<int>::Size(Dsu<int> *this,int *u)

{
  _Storage<int,_true> _Var1;
  _Storage<unsigned_long,_true> _Var2;
  _Base_ptr p_Var3;
  _Base_ptr extraout_RDX;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  _Storage<unsigned_long,_true> *p_Var7;
  optional<unsigned_long> oVar8;
  
  _Var2 = (_Storage<unsigned_long,_true>)Find(this,u);
  if ((_Var2._M_value >> 0x20 & 1) == 0) {
    uVar5 = 0;
  }
  else {
    p_Var3 = (this->size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 == (_Base_ptr)0x0) {
      p_Var7 = (_Storage<unsigned_long,_true> *)(this + 1);
      p_Var4 = extraout_RDX;
    }
    else {
      p_Var6 = &(this->size_)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = p_Var6;
      do {
        _Var1._M_value = (int)_Var2._M_value;
        if (_Var1._M_value <= (int)p_Var3[1]._M_color) {
          p_Var4 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < _Var1._M_value];
      } while (p_Var3 != (_Base_ptr)0x0);
      if ((p_Var4 != p_Var6) && ((int)p_Var4[1]._M_color <= _Var1._M_value)) {
        p_Var6 = p_Var4;
      }
      p_Var7 = (_Storage<unsigned_long,_true> *)&p_Var6[1]._M_parent;
    }
    _Var2 = (_Storage<unsigned_long,_true>)p_Var7->_M_value;
    uVar5 = CONCAT71((int7)((ulong)p_Var4 >> 8),1);
  }
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var2._M_value;
  return (optional<unsigned_long>)
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> Size(const Type& u) {
    if (auto u_rep = Find(u))
      return size_.find(*u_rep)->second;
    return {};
  }